

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::SGXMLScanner::anyAttributeValidation
          (SGXMLScanner *this,SchemaAttDef *attWildCard,uint uriId,bool *skipThisOne,
          bool *laxThisOne)

{
  AttTypes AVar1;
  DefAttTypes DVar2;
  ValueVectorOf<unsigned_int> *this_00;
  XMLSize_t XVar3;
  bool bVar4;
  uint *puVar5;
  XMLSize_t i;
  XMLSize_t getAt;
  bool bVar6;
  
  AVar1 = (attWildCard->super_XMLAttDef).fType;
  *skipThisOne = false;
  *laxThisOne = false;
  if (AVar1 != Any_Any) {
    if (AVar1 != Any_Other) {
      if (AVar1 != Any_List) {
        return false;
      }
      this_00 = attWildCard->fNamespaceList;
      if ((this_00 != (ValueVectorOf<unsigned_int> *)0x0) &&
         (XVar3 = this_00->fCurCount, XVar3 != 0)) {
        getAt = 0;
        bVar4 = false;
        do {
          bVar6 = bVar4;
          puVar5 = ValueVectorOf<unsigned_int>::elementAt(this_00,getAt);
          getAt = getAt + 1;
          bVar4 = (bool)(bVar6 | *puVar5 == uriId);
        } while (XVar3 != getAt);
        if (bVar6 || *puVar5 == uriId) goto LAB_002b3496;
      }
      return false;
    }
    if (attWildCard->fAttName->fURIId == uriId) {
      return false;
    }
    if ((this->super_XMLScanner).fEmptyNamespaceId == uriId) {
      return false;
    }
  }
LAB_002b3496:
  DVar2 = (attWildCard->super_XMLAttDef).fDefaultType;
  if ((DVar2 == ProcessContents_Skip) || (skipThisOne = laxThisOne, DVar2 == ProcessContents_Lax)) {
    *skipThisOne = true;
  }
  return true;
}

Assistant:

bool SGXMLScanner::anyAttributeValidation(SchemaAttDef* attWildCard, unsigned int uriId, bool& skipThisOne, bool& laxThisOne)
{
    XMLAttDef::AttTypes wildCardType = attWildCard->getType();
    bool anyEncountered = false;
    skipThisOne = false;
    laxThisOne = false;
    if (wildCardType == XMLAttDef::Any_Any)
        anyEncountered = true;
    else if (wildCardType == XMLAttDef::Any_Other) {
        if (attWildCard->getAttName()->getURI() != uriId
            && uriId != fEmptyNamespaceId)
            anyEncountered = true;
    }
    else if (wildCardType == XMLAttDef::Any_List) {
        ValueVectorOf<unsigned int>* nameURIList = attWildCard->getNamespaceList();
        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {
            for (XMLSize_t i=0; i < listSize; i++) {
                if (nameURIList->elementAt(i) == uriId)
                    anyEncountered = true;
            }
        }
    }

    if (anyEncountered) {
        XMLAttDef::DefAttTypes   defType   = attWildCard->getDefaultType();
        if (defType == XMLAttDef::ProcessContents_Skip) {
            // attribute should just be bypassed,
            skipThisOne = true;
            if (getPSVIHandler())
            {
                // REVISIT:
                // PSVIAttribute->setValidationAttempted(PSVIItem::VALIDATION_NONE);
            }
        }
        else if (defType == XMLAttDef::ProcessContents_Lax) {
            laxThisOne = true;
        }
    }

    return anyEncountered;
}